

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_CodeAuthenticator.cpp
# Opt level: O1

bool __thiscall axl::sys::CodeAuthenticator::verifyFile(CodeAuthenticator *this,StringRef *fileName)

{
  bool bVar1;
  int iVar2;
  Block signatureSection;
  uchar_t hash [20];
  SimpleMappedFile file;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_c8;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_b0;
  Block local_98;
  uchar_t local_88 [32];
  SimpleMappedFile local_68;
  
  local_68.m_file.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_68.m_mapping.m_mapping.m_p = (void *)0x0;
  local_68.m_mapping.m_mapping.m_size = 0;
  local_68.m_mapping.m_sharedMemory.super_File.
  super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (File)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_68.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_p = (C *)0x0;
  local_68.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_hdr._0_1_ = 0;
  local_68.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_hdr._1_7_ = 0;
  local_68.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  .m_length._0_1_ = 0;
  local_68.m_mapping.m_sharedMemoryName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
  ._17_8_ = 0;
  local_68.m_mapping.m_p = (void *)0x0;
  local_68.m_mapping.m_size = 0;
  local_68.m_openFlags = 0;
  local_98.m_p = (uchar *)0x0;
  local_98.m_size = 0;
  iVar2 = io::SimpleMappedFile::open(&local_68,(char *)fileName,0,0xffffffffffffffff,1);
  if ((char)iVar2 != '\0') {
    bVar1 = lnx::ElfHashGenerator::generateHash
                      (&this->super_ElfHashGenerator,local_68.m_mapping.m_p,
                       local_68.m_mapping.m_size,local_88,&local_98);
    if (bVar1) {
      if ((uchar *)local_98.m_p == (uchar *)0x0) {
        err::Error::Error((Error *)&local_b0,"ELF-file signature not found");
        local_c8.m_p = (ErrorHdr *)0x0;
        local_c8.m_hdr = (BufHdr *)0x0;
        local_c8.m_size = 0;
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_c8,&local_b0);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_b0);
        err::setError((ErrorRef *)&local_c8);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_c8);
      }
      else {
        iVar2 = RSA_verify(0x40,local_88,0x14,(uchar *)local_98.m_p,(uint)local_98.m_size,
                           (RSA *)(this->m_publicKey).
                                  super_Handle<rsa_st_*,_axl::cry::FreeRsa,_axl::sl::Zero<rsa_st_*>_>
                                  .m_h);
        bVar1 = true;
        if (iVar2 == 1) goto LAB_00127799;
        err::Error::Error((Error *)&local_b0,"ELF-file signature mismatch");
        local_c8.m_p = (ErrorHdr *)0x0;
        local_c8.m_hdr = (BufHdr *)0x0;
        local_c8.m_size = 0;
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_c8,&local_b0);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_b0);
        err::setError((ErrorRef *)&local_c8);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_c8);
      }
    }
  }
  bVar1 = false;
LAB_00127799:
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
            (&local_68.m_mapping.m_sharedMemoryName.
              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)
             &local_68.m_mapping.m_sharedMemory);
  io::psx::Mapping::~Mapping(&local_68.m_mapping.m_mapping);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_68);
  return bVar1;
}

Assistant:

bool
CodeAuthenticator::verifyFile(const sl::StringRef& fileName) {
	io::SimpleMappedFile file;
	uchar_t hash[SHA_DIGEST_LENGTH];
	mem::Block signatureSection;

	bool result =
		file.open(fileName, io::FileFlag_ReadOnly) &&
		generateHash(file.p(), file.getMappingSize(), hash, &signatureSection);

	if (!result)
		return false;

	if (!signatureSection.m_p)
		return err::fail("ELF-file signature not found");

	result = m_publicKey.verifyHash(
		NID_sha1,
		hash,
		sizeof(hash),
		signatureSection.m_p,
		signatureSection.m_size
	);

	if (!result)
		return err::fail("ELF-file signature mismatch");

	return true;
}